

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaDedicatedAllocationList::AddStatistics
          (VmaDedicatedAllocationList *this,VmaStatistics *inoutStats)

{
  undefined4 uVar1;
  undefined4 uVar3;
  VkDeviceSize VVar2;
  bool bVar4;
  int iVar5;
  ItemType *pIVar6;
  VkDeviceSize VVar7;
  VkDeviceSize VVar8;
  undefined1 auVar9 [16];
  
  bVar4 = this->m_UseMutex;
  if (bVar4 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  uVar1 = inoutStats->blockCount;
  uVar3 = inoutStats->allocationCount;
  iVar5 = (int)(this->m_AllocationList).m_Count;
  inoutStats->blockCount = iVar5 + uVar1;
  inoutStats->allocationCount = iVar5 + uVar3;
  pIVar6 = (this->m_AllocationList).m_Front;
  if (pIVar6 != (ItemType *)0x0) {
    VVar7 = inoutStats->blockBytes;
    VVar8 = inoutStats->allocationBytes;
    do {
      VVar2 = pIVar6->m_Size;
      auVar9._8_4_ = (int)VVar2;
      auVar9._0_8_ = VVar2;
      auVar9._12_4_ = (int)(VVar2 >> 0x20);
      VVar7 = VVar7 + VVar2;
      VVar8 = VVar8 + auVar9._8_8_;
      inoutStats->blockBytes = VVar7;
      inoutStats->allocationBytes = VVar8;
      pIVar6 = (pIVar6->field_0).m_DedicatedAllocation.m_Next;
    } while (pIVar6 != (VmaAllocation_T *)0x0);
  }
  if (bVar4 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_Mutex);
    return;
  }
  return;
}

Assistant:

void VmaDedicatedAllocationList::AddStatistics(VmaStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);

    const uint32_t allocCount = (uint32_t)m_AllocationList.GetCount();
    inoutStats.blockCount += allocCount;
    inoutStats.allocationCount += allocCount;

    for(auto* item = m_AllocationList.Front(); item != nullptr; item = DedicatedAllocationLinkedList::GetNext(item))
    {
        const VkDeviceSize size = item->GetSize();
        inoutStats.blockBytes += size;
        inoutStats.allocationBytes += size;
    }
}